

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
container_and(container_t *c1,uint8_t type1,container_t *c2,uint8_t type2,uint8_t *result_type)

{
  undefined1 uVar1;
  _Bool _Var2;
  array_container_t *local_40;
  container_t *result;
  uint8_t *result_type_local;
  array_container_t *paStack_28;
  uint8_t type2_local;
  container_t *c2_local;
  array_container_t *paStack_18;
  uint8_t type1_local;
  container_t *c1_local;
  
  result = result_type;
  result_type_local._7_1_ = type2;
  paStack_28 = (array_container_t *)c2;
  c2_local._7_1_ = type1;
  paStack_18 = (array_container_t *)c1;
  paStack_18 = (array_container_t *)container_unwrap_shared(c1,(uint8_t *)((long)&c2_local + 7));
  paStack_28 = (array_container_t *)
               container_unwrap_shared(paStack_28,(uint8_t *)((long)&result_type_local + 7));
  local_40 = (array_container_t *)0x0;
  switch((result_type_local._7_1_ - 5) + (uint)c2_local._7_1_ * 4) {
  case 0:
    _Var2 = bitset_bitset_container_intersection
                      ((bitset_container_t *)paStack_18,(bitset_container_t *)paStack_28,&local_40);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c1_local = local_40;
    break;
  case 1:
    local_40 = array_container_create();
    array_bitset_container_intersection(paStack_28,(bitset_container_t *)paStack_18,local_40);
    *(undefined1 *)result = 2;
    c1_local = local_40;
    break;
  case 2:
    _Var2 = run_bitset_container_intersection
                      ((run_container_t *)paStack_28,(bitset_container_t *)paStack_18,&local_40);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c1_local = local_40;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                  ,0x1334,
                  "container_t *container_and(const container_t *, uint8_t, const container_t *, uint8_t, uint8_t *)"
                 );
  case 4:
    local_40 = array_container_create();
    *(undefined1 *)result = 2;
    array_bitset_container_intersection(paStack_18,(bitset_container_t *)paStack_28,local_40);
    c1_local = local_40;
    break;
  case 5:
    local_40 = array_container_create();
    array_container_intersection(paStack_18,paStack_28,local_40);
    *(undefined1 *)result = 2;
    c1_local = local_40;
    break;
  case 6:
    local_40 = array_container_create();
    *(undefined1 *)result = 2;
    array_run_container_intersection(paStack_18,(run_container_t *)paStack_28,local_40);
    c1_local = local_40;
    break;
  case 8:
    _Var2 = run_bitset_container_intersection
                      ((run_container_t *)paStack_18,(bitset_container_t *)paStack_28,&local_40);
    uVar1 = 2;
    if (_Var2) {
      uVar1 = 1;
    }
    *(undefined1 *)result = uVar1;
    c1_local = local_40;
    break;
  case 9:
    local_40 = array_container_create();
    *(undefined1 *)result = 2;
    array_run_container_intersection(paStack_28,(run_container_t *)paStack_18,local_40);
    c1_local = local_40;
    break;
  case 10:
    local_40 = (array_container_t *)run_container_create();
    run_container_intersection
              ((run_container_t *)paStack_18,(run_container_t *)paStack_28,
               (run_container_t *)local_40);
    c1_local = convert_run_to_efficient_container_and_free
                         ((run_container_t *)local_40,(uint8_t *)result);
  }
  return c1_local;
}

Assistant:

static inline container_t *container_and(
    const container_t *c1, uint8_t type1,
    const container_t *c2, uint8_t type2,
    uint8_t *result_type
){
    c1 = container_unwrap_shared(c1, &type1);
    c2 = container_unwrap_shared(c2, &type2);
    container_t *result = NULL;
    switch (PAIR_CONTAINER_TYPES(type1, type2)) {
        case CONTAINER_PAIR(BITSET,BITSET):
            *result_type = bitset_bitset_container_intersection(
                                const_CAST_bitset(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,ARRAY):
            result = array_container_create();
            array_container_intersection(const_CAST_array(c1),
                                         const_CAST_array(c2),
                                         CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            return result;

        case CONTAINER_PAIR(RUN,RUN):
            result = run_container_create();
            run_container_intersection(const_CAST_run(c1),
                                       const_CAST_run(c2),
                                       CAST_run(result));
            return convert_run_to_efficient_container_and_free(
                        CAST_run(result), result_type);

        case CONTAINER_PAIR(BITSET,ARRAY):
            result = array_container_create();
            array_bitset_container_intersection(const_CAST_array(c2),
                                                const_CAST_bitset(c1),
                                                CAST_array(result));
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            return result;

        case CONTAINER_PAIR(ARRAY,BITSET):
            result = array_container_create();
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            array_bitset_container_intersection(const_CAST_array(c1),
                                                const_CAST_bitset(c2),
                                                CAST_array(result));
            return result;

        case CONTAINER_PAIR(BITSET,RUN):
            *result_type = run_bitset_container_intersection(
                                const_CAST_run(c2),
                                const_CAST_bitset(c1), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(RUN,BITSET):
            *result_type = run_bitset_container_intersection(
                                const_CAST_run(c1),
                                const_CAST_bitset(c2), &result)
                                    ? BITSET_CONTAINER_TYPE
                                    : ARRAY_CONTAINER_TYPE;
            return result;

        case CONTAINER_PAIR(ARRAY,RUN):
            result = array_container_create();
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            array_run_container_intersection(const_CAST_array(c1),
                                             const_CAST_run(c2),
                                             CAST_array(result));
            return result;

        case CONTAINER_PAIR(RUN,ARRAY):
            result = array_container_create();
            *result_type = ARRAY_CONTAINER_TYPE;  // never bitset
            array_run_container_intersection(const_CAST_array(c2),
                                             const_CAST_run(c1),
                                             CAST_array(result));
            return result;

        default:
            assert(false);
            __builtin_unreachable();
            return NULL;
    }
}